

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgToken.hpp
# Opt level: O0

TokenStream * __thiscall rsg::TokenStream::operator<<(TokenStream *this,Token *token)

{
  size_type sVar1;
  reference this_00;
  Token *token_local;
  TokenStream *this_local;
  
  sVar1 = std::vector<rsg::Token,_std::allocator<rsg::Token>_>::size(&this->m_tokens);
  if (sVar1 == this->m_numTokens) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
              (&this->m_tokens,this->m_numTokens + 0x40);
  }
  this_00 = std::vector<rsg::Token,_std::allocator<rsg::Token>_>::operator[]
                      (&this->m_tokens,this->m_numTokens);
  Token::operator=(this_00,token);
  this->m_numTokens = this->m_numTokens + 1;
  return this;
}

Assistant:

inline TokenStream& TokenStream::operator<< (const Token& token)
{
	if (m_tokens.size() == m_numTokens)
		m_tokens.resize(m_numTokens+ALLOC_SIZE);

	m_tokens[m_numTokens]	 = token;
	m_numTokens				+= 1;

	return *this;
}